

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall
HighsSparseMatrix::productTransposeQuad
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *result_value,
          vector<int,_std::allocator<int>_> *result_index,HVector *column,HighsInt debug_report)

{
  int iVar1;
  iterator iVar2;
  iterator __position;
  int iVar3;
  uint uVar4;
  int iVar5;
  pointer piVar6;
  pointer piVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  pointer piVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  HighsSparseVectorSum sum;
  HighsSparseVectorSum report_sum;
  HighsSparseVectorSum local_98;
  double local_68;
  HighsSparseVectorSum local_60;
  
  if (-2 < debug_report) {
    puts("\nHighsSparseMatrix::productTranspose:");
  }
  if (this->format_ == kColwise) {
    std::vector<double,_std::allocator<double>_>::reserve(result_value,(long)this->num_col_);
    std::vector<int,_std::allocator<int>_>::reserve(result_index,(long)this->num_col_);
    local_60.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_60.values.
                          super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_ << 0x20);
    if (0 < this->num_col_) {
      iVar3 = 0;
      do {
        piVar6 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar6[iVar3];
        lVar8 = (long)iVar1;
        iVar5 = piVar6[(long)iVar3 + 1];
        dVar15 = 0.0;
        dVar14 = 0.0;
        if (iVar1 < iVar5) {
          dVar16 = 0.0;
          do {
            dVar17 = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [(this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8]] *
                     (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar8];
            dVar15 = dVar16 + dVar17;
            dVar14 = dVar14 + (dVar16 - (dVar15 - dVar17)) + (dVar17 - (dVar15 - (dVar15 - dVar17)))
            ;
            lVar8 = lVar8 + 1;
            dVar16 = dVar15;
          } while (iVar5 != lVar8);
        }
        local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(dVar15 + dVar14);
        if ((double)local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                    _M_impl.super__Vector_impl_data._M_start < 0.0) {
          dVar14 = -dVar14;
        }
        dVar15 = (double)(~-(ulong)((double)local_98.values.
                                            super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                                            ._M_impl.super__Vector_impl_data._M_start < 0.0) &
                          (ulong)dVar15 |
                         (ulong)-dVar15 &
                         -(ulong)((double)local_98.values.
                                          super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                                          ._M_impl.super__Vector_impl_data._M_start < 0.0));
        dVar16 = dVar15 + -1e-14;
        if (0.0 < (-1e-14 - (dVar16 - dVar15)) + (dVar15 - (dVar16 - (dVar16 - dVar15))) + dVar14 +
                  dVar16) {
          iVar2._M_current =
               (result_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (result_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (result_value,iVar2,(double *)&local_98);
          }
          else {
            *iVar2._M_current =
                 (double)local_98.values.
                         super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                         super__Vector_impl_data._M_start;
            (result_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          __position._M_current =
               (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)result_index,__position,(int *)&local_60);
            iVar3 = (int)local_60.values.
                         super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                         super__Vector_impl_data._M_start;
          }
          else {
            *__position._M_current =
                 (int)local_60.values.
                      super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                      super__Vector_impl_data._M_start;
            (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
            iVar3 = (int)local_60.values.
                         super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                         super__Vector_impl_data._M_start;
          }
        }
        iVar3 = iVar3 + 1;
        local_60.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_60.values.
                               super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,iVar3);
      } while (iVar3 < this->num_col_);
    }
  }
  else {
    HighsSparseVectorSum::HighsSparseVectorSum(&local_98,this->num_col_);
    iVar3 = this->num_row_;
    if (0 < iVar3) {
      piVar6 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = 0;
      do {
        lVar9 = (long)piVar6[lVar8];
        lVar13 = lVar8 + 1;
        if (piVar6[lVar8] < piVar6[lVar8 + 1]) {
          local_68 = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar8];
          do {
            HighsSparseVectorSum::add
                      (&local_98,
                       (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar9],
                       (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar9] * local_68);
            lVar9 = lVar9 + 1;
            piVar6 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          } while (lVar9 < piVar6[lVar13]);
          iVar3 = this->num_row_;
        }
        lVar8 = lVar13;
      } while (lVar13 < iVar3);
    }
    if (-2 < debug_report) {
      HighsSparseVectorSum::HighsSparseVectorSum(&local_60,this->num_col_);
      iVar3 = this->num_row_;
      if (0 < iVar3) {
        uVar12 = 0;
        do {
          if (debug_report == -1 || (uint)debug_report == uVar12) {
            debugReportRowPrice(this,(HighsInt)uVar12,
                                (column->array).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar12],
                                (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_start[uVar12 + 1],&local_60);
            iVar3 = this->num_row_;
          }
          uVar12 = uVar12 + 1;
        } while ((long)uVar12 < (long)iVar3);
      }
      if (local_60.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_60.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.values.
                        super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    uVar12 = (ulong)((long)local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start) >> 2;
    uVar4 = (uint)uVar12;
    if (0 < (int)uVar4) {
      uVar10 = (ulong)(uVar4 & 0x7fffffff) + 1;
      do {
        iVar3 = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10 - 2];
        if (ABS(local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar3].hi +
                local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar3].lo) <= 1e-14) {
          iVar5 = (int)uVar12;
          uVar12 = (ulong)(iVar5 - 1);
          local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_start[iVar3].hi = 0.0;
          local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_start[iVar3].lo = 0.0;
          iVar1 = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)iVar5 + -1];
          local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(long)iVar5 + -1] = iVar3;
          local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10 - 2] = iVar1;
        }
        uVar4 = (uint)uVar12;
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
    }
    std::vector<int,_std::allocator<int>_>::resize(&local_98.nonzeroinds,(long)(int)uVar4);
    piVar11 = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    piVar7 = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (piVar6 != (pointer)0x0) {
      operator_delete(piVar6);
      piVar7 = (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar11 = (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    }
    uVar4 = (uint)((ulong)((long)piVar11 - (long)piVar7) >> 2);
    std::vector<double,_std::allocator<double>_>::reserve(result_value,(long)(int)uVar4);
    if (0 < (int)uVar4) {
      uVar12 = 0;
      do {
        iVar3 = (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar12];
        local_60.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(local_98.values.
                       super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar3].hi +
                      local_98.values.
                      super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar3].lo);
        iVar2._M_current =
             (result_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (result_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (result_value,iVar2,(double *)&local_60);
        }
        else {
          *iVar2._M_current =
               (double)local_60.values.
                       super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                       super__Vector_impl_data._M_start;
          (result_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        uVar12 = uVar12 + 1;
      } while ((uVar4 & 0x7fffffff) != uVar12);
    }
    if (local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.values.
                      super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::productTransposeQuad(
    vector<double>& result_value, vector<HighsInt>& result_index,
    const HVector& column, const HighsInt debug_report) const {
  if (debug_report >= kDebugReportAll)
    printf("\nHighsSparseMatrix::productTranspose:\n");
  if (this->isColwise()) {
    result_value.reserve(this->num_col_);
    result_index.reserve(this->num_col_);
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      HighsCDouble value = 0.0;
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        value += column.array[this->index_[iEl]] * this->value_[iEl];

      if (abs(value) - kHighsTiny > 0.0) {
        result_value.push_back(double(value));
        result_index.push_back(iCol);
      }
    }
  } else {
    HighsSparseVectorSum sum(num_col_);
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      double multiplier = column.array[iRow];
      for (HighsInt iEl = this->start_[iRow]; iEl < this->start_[iRow + 1];
           iEl++)
        sum.add(this->index_[iEl], multiplier * this->value_[iEl]);
    }
    if (debug_report >= kDebugReportAll) {
      HighsSparseVectorSum report_sum(num_col_);
      for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
        double multiplier = column.array[iRow];
        if (debug_report == kDebugReportAll || debug_report == iRow)
          debugReportRowPrice(iRow, multiplier, this->start_[iRow + 1],
                              report_sum);
      }
    }

    sum.cleanup([](HighsInt, double x) { return std::abs(x) <= kHighsTiny; });
    result_index = std::move(sum.nonzeroinds);
    HighsInt result_num_nz = result_index.size();
    result_value.reserve(result_num_nz);
    for (HighsInt i = 0; i < result_num_nz; ++i)
      result_value.push_back(sum.getValue(result_index[i]));
  }
}